

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::Directory::Replacer<kj::File>_>::dispose(Own<kj::Directory::Replacer<kj::File>_> *this)

{
  Replacer<kj::File> *object;
  Replacer<kj::File> *ptrCopy;
  Own<kj::Directory::Replacer<kj::File>_> *this_local;
  
  object = this->ptr;
  if (object != (Replacer<kj::File> *)0x0) {
    this->ptr = (Replacer<kj::File> *)0x0;
    Disposer::dispose<kj::Directory::Replacer<kj::File>>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }